

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdesktopunixservices.cpp
# Opt level: O0

bool __thiscall QDesktopUnixServices::openDocument(QDesktopUnixServices *this,QUrl *url)

{
  byte bVar1;
  anon_class_8_1_8991fb9c_for_openDocumentInternal *in_RSI;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  anon_class_8_1_8991fb9c_for_openDocumentInternal openDocumentInternal;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  char *in_stack_ffffffffffffff78;
  bool local_51;
  QUrl in_stack_ffffffffffffffd0;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QGuiApplication::platformName();
  QVar2 = Qt::Literals::StringLiterals::operator____L1
                    (in_stack_ffffffffffffff78,
                     CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  bVar1 = QString::startsWith((QLatin1String *)local_28,(CaseSensitivity)QVar2.m_size);
  QString::~QString((QString *)0xac8b0e);
  if ((bVar1 & 1) == 0) {
    QString::QString((QString *)0xac8b67);
    local_51 = QtPrivate::detail::
               StorageByValue<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/platform/unix/qdesktopunixservices.cpp:541:35),_void>
               ::anon_class_16_2_6708b258_for_o::anon_class_8_1_8991fb9c_for_openDocumentInternal::
               operator()(in_RSI,(QUrl *)QVar2.m_data,(QString *)QVar2.m_size);
    QString::~QString((QString *)0xac8b8e);
  }
  else {
    QUrl::QUrl((QUrl *)&stack0xffffffffffffffd0,(QUrl *)in_RSI);
    runWithXdgActivationToken<QDesktopUnixServices::openDocument(QUrl_const&)::__0>
              ((anon_class_16_2_6708b258_for_o *)in_stack_ffffffffffffffd0.d);
    openDocument(QUrl_const&)::$_0::~__0((anon_class_16_2_6708b258_for_o *)0xac8b4c);
    local_51 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_51;
  }
  __stack_chk_fail();
}

Assistant:

bool QDesktopUnixServices::openDocument(const QUrl &url)
{
    auto openDocumentInternal = [this](const QUrl &url, const QString &xdgActivationToken) {

#  if QT_CONFIG(dbus)
        if (checkNeedPortalSupport()) {
            const QString parentWindow = QGuiApplication::focusWindow()
                    ? portalWindowIdentifier(QGuiApplication::focusWindow())
                    : QString();
            QDBusError error = xdgDesktopPortalOpenFile(url, parentWindow, xdgActivationToken);
            if (!error.isValid())
                return true;
        }
#  endif

        if (m_documentLauncher.isEmpty()
            && !detectWebBrowser(desktopEnvironment(), false, &m_documentLauncher)) {
            qCWarning(lcQpaServices, "Unable to detect a launcher for '%s'", qPrintable(url.toString()));
            return false;
        }
        return launch(m_documentLauncher, url, xdgActivationToken);
    };

    if (QGuiApplication::platformName().startsWith("wayland"_L1)) {
        runWithXdgActivationToken([openDocumentInternal, url](const QString &token) {
            openDocumentInternal(url, token);
        });

        return true;
    } else {
        return openDocumentInternal(url, QString());
    }
}